

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O0

Maybe<kj::Url> *
kj::Url::tryParse(Maybe<kj::Url> *__return_storage_ptr__,StringPtr text,Context context,
                 Options options)

{
  bool bVar1;
  uchar *puVar2;
  ArrayPtr<const_char> *pAVar3;
  char *pcVar4;
  size_t sVar5;
  NullableValue<kj::ArrayPtr<const_char>_> *pNVar6;
  ArrayPtr<const_char> *pAVar7;
  Url *t;
  ArrayPtr<const_char> *params;
  Options *in_R9;
  StringPtr SVar8;
  ArrayPtr<const_char> AVar9;
  ArrayPtr<const_char> text_00;
  ArrayPtr<const_char> text_01;
  ArrayPtr<const_char> text_02;
  ArrayPtr<const_char> text_03;
  ArrayPtr<const_char> text_04;
  ArrayPtr<const_char> text_05;
  ArrayPtr<const_char> text_06;
  ArrayPtr<const_char> text_07;
  byte local_5e1;
  Fault local_590;
  Fault f;
  size_t local_580;
  DebugExpression<unsigned_long> local_578;
  undefined1 local_570 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  String local_528;
  StringPtr local_508;
  StringPtr local_4f8;
  size_t local_4e8;
  char *pcStack_4e0;
  QueryParam local_4d8;
  size_t local_4a8;
  char *pcStack_4a0;
  anon_unknown_0 *local_498;
  char *pcStack_490;
  QueryParam local_480;
  ArrayPtr<const_char> *local_450;
  ArrayPtr<const_char> *key;
  undefined1 local_430 [8];
  NullableValue<kj::ArrayPtr<const_char>_> _key252;
  ArrayPtr<const_char> part_1;
  StringPtr local_3f8;
  anon_unknown_0 *local_3e8;
  char *pcStack_3e0;
  String local_3d8;
  undefined1 auStack_3c0 [8];
  ArrayPtr<const_char> part;
  StringPtr local_3a0;
  ArrayPtr<const_char> local_388;
  size_t local_378;
  char *pcStack_370;
  String local_368;
  anon_unknown_0 *local_348;
  char *pcStack_340;
  UserInfo local_338;
  undefined1 local_2f9;
  anon_unknown_0 *local_2f8;
  char *pcStack_2f0;
  String local_2e0;
  anon_unknown_0 *local_2c8;
  char *pcStack_2c0;
  UserInfo local_2b8;
  ArrayPtr<const_char> *local_280;
  ArrayPtr<const_char> *username;
  undefined1 local_260 [8];
  NullableValue<kj::ArrayPtr<const_char>_> _username209;
  ArrayPtr<const_char> *userpass;
  undefined1 local_220 [8];
  NullableValue<kj::ArrayPtr<const_char>_> _userpass204;
  ArrayPtr<const_char> authority;
  StringPtr local_1e0;
  ArrayPtr<const_char> local_1c8;
  ArrayPtr<const_char> local_1b8;
  String local_1a0;
  kj *local_188;
  ArrayPtr<const_char> *scheme;
  undefined1 local_168 [8];
  NullableValue<kj::ArrayPtr<const_char>_> _scheme181;
  StringPtr local_148;
  CharGroup_ *local_138;
  CharGroup_ *END_QUERY_PART;
  CharGroup_ *local_120;
  CharGroup_ *END_PATH_PART;
  undefined1 local_110 [7];
  bool err;
  Url result;
  Context context_local;
  Options options_local;
  StringPtr text_local;
  
  _context_local = text.content.ptr;
  result._216_4_ = context;
  result._222_2_ = options;
  Url((Url *)local_110);
  result.fragment.ptr.field_1._16_2_ = result._222_2_;
  END_PATH_PART._7_1_ = 0;
  local_120 = anon_unknown_0::getEndPathPart(result._216_4_);
  local_138 = anon_unknown_0::getEndQueryPart(result._216_4_);
  if (result._216_4_ == 2) {
    StringPtr::StringPtr(&local_148,"/");
    bVar1 = StringPtr::startsWith((StringPtr *)&context_local,&local_148);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      Maybe<kj::Url>::Maybe(__return_storage_ptr__);
      _scheme181.field_1.value.size_._0_4_ = 1;
      goto LAB_008560f2;
    }
  }
  else {
    anon_unknown_0::trySplit
              ((Maybe<kj::ArrayPtr<const_char>_> *)&scheme,(StringPtr *)&context_local,':');
    pNVar6 = kj::_::readMaybe<kj::ArrayPtr<char_const>>((Maybe<kj::ArrayPtr<const_char>_> *)&scheme)
    ;
    kj::_::NullableValue<kj::ArrayPtr<const_char>_>::NullableValue
              ((NullableValue<kj::ArrayPtr<const_char>_> *)local_168,pNVar6);
    Maybe<kj::ArrayPtr<const_char>_>::~Maybe((Maybe<kj::ArrayPtr<const_char>_> *)&scheme);
    pAVar7 = kj::_::NullableValue::operator_cast_to_ArrayPtr_((NullableValue *)local_168);
    if (pAVar7 == (ArrayPtr<const_char> *)0x0) {
      Maybe<kj::Url>::Maybe(__return_storage_ptr__);
    }
    else {
      local_188 = (kj *)kj::_::NullableValue<kj::ArrayPtr<const_char>_>::operator*
                                  ((NullableValue<kj::ArrayPtr<const_char>_> *)local_168);
      str<kj::ArrayPtr<char_const>&>(&local_1a0,local_188,params);
      String::operator=((String *)local_110,&local_1a0);
      String::~String(&local_1a0);
    }
    _scheme181.field_1.value.size_._1_3_ = 0;
    _scheme181.field_1.value.size_._0_1_ = pAVar7 == (ArrayPtr<const_char> *)0x0;
    kj::_::NullableValue<kj::ArrayPtr<const_char>_>::~NullableValue
              ((NullableValue<kj::ArrayPtr<const_char>_> *)local_168);
    if (_scheme181.field_1.value.size_._0_4_ != 0) goto LAB_008560f2;
    anon_unknown_0::toLower((String *)local_110);
    sVar5 = String::size((String *)local_110);
    local_5e1 = 1;
    if (sVar5 != 0) {
      puVar2 = (uchar *)String::operator[]((String *)local_110,0);
      bVar1 = kj::parse::CharGroup_::contains
                        ((CharGroup_ *)kj::(anonymous_namespace)::ALPHAS,*puVar2);
      local_5e1 = 1;
      if (bVar1) {
        local_1c8 = (ArrayPtr<const_char>)String::slice((String *)local_110,1);
        local_1b8 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_1c8);
        bVar1 = kj::parse::CharGroup_::containsAll
                          ((CharGroup_ *)kj::(anonymous_namespace)::SCHEME_CHARS,local_1b8);
        local_5e1 = bVar1 ^ 0xff;
      }
    }
    if ((local_5e1 & 1) != 0) {
      Maybe<kj::Url>::Maybe(__return_storage_ptr__);
      _scheme181.field_1.value.size_._0_4_ = 1;
      goto LAB_008560f2;
    }
    StringPtr::StringPtr(&local_1e0,"//");
    bVar1 = StringPtr::startsWith((StringPtr *)&context_local,&local_1e0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      Maybe<kj::Url>::Maybe(__return_storage_ptr__);
      _scheme181.field_1.value.size_._0_4_ = 1;
      goto LAB_008560f2;
    }
    SVar8 = StringPtr::slice((StringPtr *)&context_local,2);
    _context_local = SVar8.content.ptr;
    AVar9 = anon_unknown_0::split
                      ((StringPtr *)&context_local,
                       (CharGroup_ *)kj::(anonymous_namespace)::END_AUTHORITY);
    text_02.ptr = (char *)AVar9.size_;
    _userpass204.field_1.value.size_ = (size_t)AVar9.ptr;
    anon_unknown_0::trySplit
              ((Maybe<kj::ArrayPtr<const_char>_> *)&userpass,
               (ArrayPtr<const_char> *)((long)&_userpass204.field_1 + 8),'@');
    pNVar6 = kj::_::readMaybe<kj::ArrayPtr<char_const>>
                       ((Maybe<kj::ArrayPtr<const_char>_> *)&userpass);
    kj::_::NullableValue<kj::ArrayPtr<const_char>_>::NullableValue
              ((NullableValue<kj::ArrayPtr<const_char>_> *)local_220,pNVar6);
    Maybe<kj::ArrayPtr<const_char>_>::~Maybe((Maybe<kj::ArrayPtr<const_char>_> *)&userpass);
    pAVar7 = kj::_::NullableValue::operator_cast_to_ArrayPtr_((NullableValue *)local_220);
    if (pAVar7 == (ArrayPtr<const_char> *)0x0) {
LAB_008556c4:
      _scheme181.field_1.value.size_._0_4_ = 0;
    }
    else {
      pAVar7 = kj::_::NullableValue<kj::ArrayPtr<const_char>_>::operator*
                         ((NullableValue<kj::ArrayPtr<const_char>_> *)local_220);
      if (result._216_4_ == 0) {
        anon_unknown_0::trySplit((Maybe<kj::ArrayPtr<const_char>_> *)&username,pAVar7,':');
        pNVar6 = kj::_::readMaybe<kj::ArrayPtr<char_const>>
                           ((Maybe<kj::ArrayPtr<const_char>_> *)&username);
        kj::_::NullableValue<kj::ArrayPtr<const_char>_>::NullableValue
                  ((NullableValue<kj::ArrayPtr<const_char>_> *)local_260,pNVar6);
        Maybe<kj::ArrayPtr<const_char>_>::~Maybe((Maybe<kj::ArrayPtr<const_char>_> *)&username);
        pAVar3 = kj::_::NullableValue::operator_cast_to_ArrayPtr_((NullableValue *)local_260);
        if (pAVar3 == (ArrayPtr<const_char> *)0x0) {
          local_348 = (anon_unknown_0 *)pAVar7->ptr;
          pcStack_340 = (char *)pAVar7->size_;
          AVar9.size_ = (long)&END_PATH_PART + 7;
          AVar9.ptr = pcStack_340;
          anon_unknown_0::percentDecode
                    (&local_338.username,local_348,AVar9,(bool *)&result.field_0xde,in_R9);
          Maybe<kj::String>::Maybe(&local_338.password);
          Maybe<kj::Url::UserInfo>::operator=
                    ((Maybe<kj::Url::UserInfo> *)&result.scheme.content.disposer,&local_338);
          UserInfo::~UserInfo(&local_338);
        }
        else {
          local_280 = kj::_::NullableValue<kj::ArrayPtr<const_char>_>::operator*
                                ((NullableValue<kj::ArrayPtr<const_char>_> *)local_260);
          local_2c8 = (anon_unknown_0 *)local_280->ptr;
          pcStack_2c0 = (char *)local_280->size_;
          text_00.size_ = (long)&END_PATH_PART + 7;
          text_00.ptr = pcStack_2c0;
          anon_unknown_0::percentDecode
                    (&local_2b8.username,local_2c8,text_00,(bool *)&result.field_0xde,in_R9);
          local_2f9 = 1;
          local_2f8 = (anon_unknown_0 *)pAVar7->ptr;
          pcStack_2f0 = (char *)pAVar7->size_;
          text_01.size_ = (long)&END_PATH_PART + 7;
          text_01.ptr = pcStack_2f0;
          anon_unknown_0::percentDecode
                    (&local_2e0,local_2f8,text_01,(bool *)&result.field_0xde,in_R9);
          Maybe<kj::String>::Maybe(&local_2b8.password,&local_2e0);
          local_2f9 = 0;
          Maybe<kj::Url::UserInfo>::operator=
                    ((Maybe<kj::Url::UserInfo> *)&result.scheme.content.disposer,&local_2b8);
          UserInfo::~UserInfo(&local_2b8);
          String::~String(&local_2e0);
        }
        kj::_::NullableValue<kj::ArrayPtr<const_char>_>::~NullableValue
                  ((NullableValue<kj::ArrayPtr<const_char>_> *)local_260);
        goto LAB_008556c4;
      }
      Maybe<kj::Url>::Maybe(__return_storage_ptr__);
      _scheme181.field_1.value.size_._0_4_ = 1;
    }
    kj::_::NullableValue<kj::ArrayPtr<const_char>_>::~NullableValue
              ((NullableValue<kj::ArrayPtr<const_char>_> *)local_220);
    if (_scheme181.field_1.value.size_._0_4_ != 0) goto LAB_008560f2;
    local_378 = _userpass204.field_1.value.size_;
    text_02.size_ = (long)&END_PATH_PART + 7;
    pcStack_370 = text_02.ptr;
    anon_unknown_0::percentDecode
              (&local_368,(anon_unknown_0 *)_userpass204.field_1.value.size_,text_02,
               (bool *)&result.field_0xde,in_R9);
    String::operator=((String *)
                      ((long)&result.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10),
                      &local_368);
    String::~String(&local_368);
    local_388 = String::operator_cast_to_ArrayPtr
                          ((String *)
                           ((long)&result.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10));
    bVar1 = kj::parse::CharGroup_::containsAll
                      ((CharGroup_ *)kj::(anonymous_namespace)::HOST_CHARS,local_388);
    if (!bVar1) {
      Maybe<kj::Url>::Maybe(__return_storage_ptr__);
      _scheme181.field_1.value.size_._0_4_ = 1;
      goto LAB_008560f2;
    }
    anon_unknown_0::toLower
              ((String *)((long)&result.userInfo.ptr.field_1.value.password.ptr.field_1 + 0x10));
  }
LAB_00855809:
  StringPtr::StringPtr(&local_3a0,"/");
  bVar1 = StringPtr::startsWith((StringPtr *)&context_local,&local_3a0);
  if (bVar1) {
    SVar8 = StringPtr::slice((StringPtr *)&context_local,1);
    part.size_ = (size_t)SVar8.content.ptr;
    _context_local = (char *)part.size_;
    AVar9 = anon_unknown_0::split((StringPtr *)&context_local,local_120);
    part.ptr = (char *)AVar9.size_;
    auStack_3c0 = (undefined1  [8])AVar9.ptr;
    sVar5 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_3c0);
    if (sVar5 == 2) {
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)auStack_3c0,0);
      if (*pcVar4 == '.') {
        pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)auStack_3c0,1);
        if (*pcVar4 == '.') {
          sVar5 = Vector<kj::String>::size((Vector<kj::String> *)&result.host.content.disposer);
          if (sVar5 != 0) {
            Vector<kj::String>::removeLast((Vector<kj::String> *)&result.host.content.disposer);
          }
          result.path.builder.disposer._0_1_ = 1;
          goto LAB_00855809;
        }
      }
    }
    sVar5 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_3c0);
    if (sVar5 == 0) {
      if ((result._222_2_ & 0x100) != 0) {
        sVar5 = StringPtr::size((StringPtr *)&context_local);
        if (sVar5 != 0) goto LAB_008559bf;
      }
LAB_00855a09:
      result.path.builder.disposer._0_1_ = 1;
    }
    else {
LAB_008559bf:
      sVar5 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_3c0);
      if (sVar5 == 1) {
        pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)auStack_3c0,0);
        if (*pcVar4 == '.') goto LAB_00855a09;
      }
      local_3e8 = (anon_unknown_0 *)auStack_3c0;
      pcStack_3e0 = part.ptr;
      text_03.size_ = (long)&END_PATH_PART + 7;
      text_03.ptr = part.ptr;
      anon_unknown_0::percentDecode
                (&local_3d8,(anon_unknown_0 *)auStack_3c0,text_03,(bool *)&result.field_0xde,in_R9);
      Vector<kj::String>::add<kj::String>
                ((Vector<kj::String> *)&result.host.content.disposer,&local_3d8);
      String::~String(&local_3d8);
      result.path.builder.disposer._0_1_ = 0;
    }
    goto LAB_00855809;
  }
  StringPtr::StringPtr(&local_3f8,"?");
  bVar1 = StringPtr::startsWith((StringPtr *)&context_local,&local_3f8);
  if (bVar1) {
    do {
      SVar8 = StringPtr::slice((StringPtr *)&context_local,1);
      _context_local = SVar8.content.ptr;
      AVar9 = anon_unknown_0::split((StringPtr *)&context_local,local_138);
      text_05.ptr = (char *)AVar9.size_;
      _key252.field_1.value.size_ = (size_t)AVar9.ptr;
      sVar5 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)((long)&_key252.field_1 + 8));
      if ((sVar5 != 0) || ((result._222_2_ & 0x100) != 0)) {
        anon_unknown_0::trySplit
                  ((Maybe<kj::ArrayPtr<const_char>_> *)&key,
                   (ArrayPtr<const_char> *)((long)&_key252.field_1 + 8),'=');
        pNVar6 = kj::_::readMaybe<kj::ArrayPtr<char_const>>
                           ((Maybe<kj::ArrayPtr<const_char>_> *)&key);
        kj::_::NullableValue<kj::ArrayPtr<const_char>_>::NullableValue
                  ((NullableValue<kj::ArrayPtr<const_char>_> *)local_430,pNVar6);
        Maybe<kj::ArrayPtr<const_char>_>::~Maybe((Maybe<kj::ArrayPtr<const_char>_> *)&key);
        pAVar7 = kj::_::NullableValue::operator_cast_to_ArrayPtr_((NullableValue *)local_430);
        if (pAVar7 == (ArrayPtr<const_char> *)0x0) {
          local_4e8 = _key252.field_1.value.size_;
          text_06.size_ = (long)&END_PATH_PART + 7;
          text_06.ptr = text_05.ptr;
          pcStack_4e0 = text_05.ptr;
          anon_unknown_0::percentDecodeQuery
                    (&local_4d8.name,(anon_unknown_0 *)_key252.field_1.value.size_,text_06,
                     (bool *)&result.field_0xde,in_R9);
          String::String(&local_4d8.value,(void *)0x0);
          Vector<kj::Url::QueryParam>::add<kj::Url::QueryParam>
                    ((Vector<kj::Url::QueryParam> *)&result.hasTrailingSlash,&local_4d8);
          QueryParam::~QueryParam(&local_4d8);
        }
        else {
          local_450 = kj::_::NullableValue<kj::ArrayPtr<const_char>_>::operator*
                                ((NullableValue<kj::ArrayPtr<const_char>_> *)local_430);
          local_498 = (anon_unknown_0 *)local_450->ptr;
          pcStack_490 = (char *)local_450->size_;
          text_04.size_ = (long)&END_PATH_PART + 7;
          text_04.ptr = pcStack_490;
          anon_unknown_0::percentDecodeQuery
                    (&local_480.name,local_498,text_04,(bool *)&result.field_0xde,in_R9);
          local_4a8 = _key252.field_1.value.size_;
          text_05.size_ = (long)&END_PATH_PART + 7;
          pcStack_4a0 = text_05.ptr;
          anon_unknown_0::percentDecodeQuery
                    (&local_480.value,(anon_unknown_0 *)_key252.field_1.value.size_,text_05,
                     (bool *)&result.field_0xde,in_R9);
          Vector<kj::Url::QueryParam>::add<kj::Url::QueryParam>
                    ((Vector<kj::Url::QueryParam> *)&result.hasTrailingSlash,&local_480);
          QueryParam::~QueryParam(&local_480);
        }
        kj::_::NullableValue<kj::ArrayPtr<const_char>_>::~NullableValue
                  ((NullableValue<kj::ArrayPtr<const_char>_> *)local_430);
      }
      StringPtr::StringPtr(&local_4f8,"&");
      bVar1 = StringPtr::startsWith((StringPtr *)&context_local,&local_4f8);
    } while (bVar1);
  }
  StringPtr::StringPtr(&local_508,"#");
  bVar1 = StringPtr::startsWith((StringPtr *)&context_local,&local_508);
  if (bVar1) {
    if (result._216_4_ != 0) {
      Maybe<kj::Url>::Maybe(__return_storage_ptr__);
      _scheme181.field_1.value.size_._0_4_ = 1;
      goto LAB_008560f2;
    }
    SVar8 = StringPtr::slice((StringPtr *)&context_local,1);
    _kjCondition._32_8_ = SVar8.content.ptr;
    AVar9 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&_kjCondition.result);
    text_07.ptr = (char *)AVar9.size_;
    text_07.size_ = (long)&END_PATH_PART + 7;
    anon_unknown_0::percentDecode
              (&local_528,(anon_unknown_0 *)AVar9.ptr,text_07,(bool *)&result.field_0xde,in_R9);
    Maybe<kj::String>::operator=((Maybe<kj::String> *)&result.query.builder.disposer,&local_528);
    String::~String(&local_528);
  }
  else {
    local_580 = StringPtr::size((StringPtr *)&context_local);
    local_578 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_580);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_int> *)local_570,&local_578,
               (int *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_570);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                (&local_590,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
                 ,0x10e,FAILED,"text.size() == 0","_kjCondition,",
                 (DebugComparison<unsigned_long,_int> *)local_570);
      kj::_::Debug::Fault::fatal(&local_590);
    }
  }
  if ((END_PATH_PART._7_1_ & 1) == 0) {
    t = mv<kj::Url>((Url *)local_110);
    Maybe<kj::Url>::Maybe(__return_storage_ptr__,t);
    _scheme181.field_1.value.size_._0_4_ = 1;
  }
  else {
    Maybe<kj::Url>::Maybe(__return_storage_ptr__);
    _scheme181.field_1.value.size_._0_4_ = 1;
  }
LAB_008560f2:
  ~Url((Url *)local_110);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Url> Url::tryParse(StringPtr text, Context context, Options options) {
  Url result;
  result.options = options;
  bool err = false;  // tracks percent-decoding errors

  auto& END_PATH_PART = getEndPathPart(context);
  auto& END_QUERY_PART = getEndQueryPart(context);

  if (context == HTTP_REQUEST) {
    if (!text.startsWith("/")) {
      return kj::none;
    }
  } else {
    KJ_IF_SOME(scheme, trySplit(text, ':')) {
      result.scheme = kj::str(scheme);
    } else {
      // missing scheme
      return kj::none;
    }
    toLower(result.scheme);
    if (result.scheme.size() == 0 ||
        !ALPHAS.contains(result.scheme[0]) ||
        !SCHEME_CHARS.containsAll(result.scheme.slice(1))) {
      // bad scheme
      return kj::none;
    }

    if (!text.startsWith("//")) {
      // We require an authority (hostname) part.
      return kj::none;
    }
    text = text.slice(2);

    {
      auto authority = split(text, END_AUTHORITY);

      KJ_IF_SOME(userpass, trySplit(authority, '@')) {
        if (context != REMOTE_HREF) {
          // No user/pass allowed here.
          return kj::none;
        }
        KJ_IF_SOME(username, trySplit(userpass, ':')) {
          result.userInfo = UserInfo {
            percentDecode(username, err, options),
            percentDecode(userpass, err, options)
          };
        } else {
          result.userInfo = UserInfo {
            percentDecode(userpass, err, options),
            kj::none
          };
        }
      }

      result.host = percentDecode(authority, err, options);
      if (!HOST_CHARS.containsAll(result.host)) return kj::none;
      toLower(result.host);
    }